

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationResult.cpp
# Opt level: O2

void __thiscall SimulationResult::Print(SimulationResult *this)

{
  ostream *poVar1;
  uint i;
  ulong uVar2;
  
  if ((ulong)((long)(this->_m_rewards).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->_m_rewards).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) < (ulong)this->_m_nr_stored) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"SimulationResult::Print error _m_nr_stored ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," > ");
    poVar1 = std::operator<<(poVar1," _m_rewards.size() ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"SimulationResult::Print horizon ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," seed ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->_m_random_seed);
  poVar1 = std::operator<<(poVar1," entries ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"SimulationResult::Print Rewards: ");
  for (uVar2 = 0; uVar2 < this->_m_nr_stored; uVar2 = uVar2 + 1) {
    poVar1 = std::ostream::_M_insert<double>
                       ((this->_m_rewards).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar2]);
    std::operator<<(poVar1," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"SimulationResult::Print Average reward ");
  poVar1 = std::ostream::_M_insert<double>(this->_m_avg_reward);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void SimulationResult::Print(void)
{
    if(_m_nr_stored>_m_rewards.size())
        cerr << "SimulationResult::Print error _m_nr_stored " << _m_nr_stored  
             << " > " << " _m_rewards.size() " << _m_rewards.size() << endl;

    cout << "SimulationResult::Print horizon " << _m_horizon << " seed "
         << _m_random_seed << " entries " << _m_nr_stored << endl;
    cout << "SimulationResult::Print Rewards: ";
    for(unsigned int i=0;i<_m_nr_stored;i++)
        cout << _m_rewards[i] << " ";
    cout << endl;
    cout << "SimulationResult::Print Average reward " << _m_avg_reward << endl;
}